

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O2

int thrd_join(thrd_t thr,int *res)

{
  int iVar1;
  int iVar2;
  void *in_RAX;
  void *pres;
  
  pres = in_RAX;
  iVar1 = pthread_join(thr,&pres);
  iVar2 = 0;
  if (iVar1 == 0) {
    if (pres == (void *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = *pres;
      free(pres);
    }
    iVar2 = 1;
    if (res != (int *)0x0) {
      *res = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int thrd_join(thrd_t thr, int *res)
{
#if defined(_TTHREAD_WIN32_)
  if (WaitForSingleObject(thr, INFINITE) == WAIT_FAILED)
  {
    return thrd_error;
  }
  if (res != NULL)
  {
    DWORD dwRes;
    GetExitCodeThread(thr, &dwRes);
    *res = dwRes;
  }
#elif defined(_TTHREAD_POSIX_)
  void *pres;
  int ires = 0;
  if (pthread_join(thr, &pres) != 0)
  {
    return thrd_error;
  }
  if (pres != NULL)
  {
    ires = *(int*)pres;
    free(pres);
  }
  if (res != NULL)
  {
    *res = ires;
  }
#endif
  return thrd_success;
}